

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_wordwrap(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  jx9_value *pObj;
  int iVar2;
  undefined8 in_RAX;
  char *zString;
  char *zString_00;
  int nLen;
  char *zString_01;
  long lVar3;
  int iBreaklen;
  int iLen;
  int local_38;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if ((nArg < 1) || (zString = jx9_value_to_string(*apArg,&local_34), local_34 < 1)) {
    jx9_value_string(pCtx->pRet,"",0);
    return 0;
  }
  local_38 = 0;
  iVar2 = 0x4b;
  if (nArg != 1) {
    pObj = apArg[1];
    jx9MemObjToInteger(pObj);
    iVar1 = *(int *)&pObj->x;
    iVar2 = 0x4b;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    if ((2 < (uint)nArg) && (zString_00 = jx9_value_to_string(apArg[2],&local_38), 0 < local_38))
    goto LAB_00132226;
  }
  local_38 = 1;
  zString_00 = "\n";
LAB_00132226:
  iVar1 = local_34;
  lVar3 = (long)local_34;
  if (0 < lVar3) {
    nLen = local_34;
    if (iVar2 < local_34) {
      nLen = iVar2;
    }
    jx9_value_string(pCtx->pRet,zString,nLen);
    if (iVar2 < iVar1) {
      zString_01 = zString + nLen;
      do {
        jx9_value_string(pCtx->pRet,zString_00,local_38);
        iVar2 = (int)(zString + lVar3) - (int)zString_01;
        if (iVar2 <= nLen) {
          nLen = iVar2;
        }
        jx9_value_string(pCtx->pRet,zString_01,nLen);
        zString_01 = zString_01 + nLen;
      } while (zString_01 < zString + lVar3);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_wordwrap(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zBreak;
	int iLen, iBreaklen, iChunk;
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Nothing to process, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Chunk length */
	iChunk = 75;
	iBreaklen = 0;
	zBreak = ""; /* cc warning */
	if( nArg > 1 ){
		iChunk = jx9_value_to_int(apArg[1]);
		if( iChunk < 1 ){
			iChunk = 75;
		}
		if( nArg > 2 ){
			zBreak = jx9_value_to_string(apArg[2], &iBreaklen);
		}
	}
	if( iBreaklen < 1 ){
		/* Set a default column break */
#ifdef __WINNT__
		zBreak = "\r\n";
		iBreaklen = (int)sizeof("\r\n")-1;
#else
		zBreak = "\n";
		iBreaklen = (int)sizeof(char);
#endif
	}
	/* Perform the requested operation */
	zEnd = &zIn[iLen];
	for(;;){
		int nMax;
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		nMax = (int)(zEnd-zIn);
		if( iChunk > nMax ){
			iChunk = nMax;
		}
		/* Append the column first */
		jx9_result_string(pCtx, zIn, iChunk); /* Will make it's own copy */
		/* Advance the cursor */
		zIn += iChunk;
		if( zIn < zEnd ){
			/* Append the line break */
			jx9_result_string(pCtx, zBreak, iBreaklen);
		}
	}
	return JX9_OK;
}